

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_size.c
# Opt level: O0

int kseq_read(kseq_t *seq)

{
  kstream_t *ks_00;
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  kstream_t *ks;
  kseq_t *pkStack_18;
  int c;
  kseq_t *seq_local;
  
  ks_00 = seq->f;
  pkStack_18 = seq;
  if (seq->last_char == 0) {
    do {
      ks._4_4_ = ks_getc(ks_00);
      bVar4 = false;
      if ((ks._4_4_ != -1) && (bVar4 = false, ks._4_4_ != 0x3e)) {
        bVar4 = ks._4_4_ != 0x40;
      }
    } while (bVar4);
    if (ks._4_4_ == -1) {
      return -1;
    }
    pkStack_18->last_char = ks._4_4_;
  }
  (pkStack_18->qual).l = 0;
  (pkStack_18->seq).l = 0;
  (pkStack_18->comment).l = 0;
  iVar2 = ks_getuntil(ks_00,0,&pkStack_18->name,(int *)((long)&ks + 4));
  if (iVar2 < 0) {
    seq_local._4_4_ = -1;
  }
  else {
    if (ks._4_4_ != 10) {
      ks_getuntil(ks_00,2,&pkStack_18->comment,(int *)0x0);
    }
    if ((pkStack_18->seq).s == (char *)0x0) {
      (pkStack_18->seq).m = 0x100;
      pcVar3 = (char *)malloc((pkStack_18->seq).m);
      (pkStack_18->seq).s = pcVar3;
    }
    while( true ) {
      ks._4_4_ = ks_getc(ks_00);
      bVar4 = false;
      if (((ks._4_4_ != -1) && (bVar4 = false, ks._4_4_ != 0x3e)) &&
         (bVar4 = false, ks._4_4_ != 0x2b)) {
        bVar4 = ks._4_4_ != 0x40;
      }
      if (!bVar4) break;
      if (ks._4_4_ != 10) {
        sVar1 = (pkStack_18->seq).l;
        (pkStack_18->seq).l = sVar1 + 1;
        (pkStack_18->seq).s[sVar1] = (char)ks._4_4_;
        ks_getuntil2(ks_00,2,&pkStack_18->seq,(int *)0x0,1);
      }
    }
    if ((ks._4_4_ == 0x3e) || (ks._4_4_ == 0x40)) {
      pkStack_18->last_char = ks._4_4_;
    }
    if ((pkStack_18->seq).m <= (pkStack_18->seq).l + 1) {
      (pkStack_18->seq).m = (pkStack_18->seq).l + 2;
      (pkStack_18->seq).m = (pkStack_18->seq).m - 1;
      (pkStack_18->seq).m = (pkStack_18->seq).m >> 1 | (pkStack_18->seq).m;
      (pkStack_18->seq).m = (pkStack_18->seq).m >> 2 | (pkStack_18->seq).m;
      (pkStack_18->seq).m = (pkStack_18->seq).m >> 4 | (pkStack_18->seq).m;
      (pkStack_18->seq).m = (pkStack_18->seq).m >> 8 | (pkStack_18->seq).m;
      (pkStack_18->seq).m = (pkStack_18->seq).m >> 0x10 | (pkStack_18->seq).m;
      (pkStack_18->seq).m = (pkStack_18->seq).m + 1;
      pcVar3 = (char *)realloc((pkStack_18->seq).s,(pkStack_18->seq).m);
      (pkStack_18->seq).s = pcVar3;
    }
    (pkStack_18->seq).s[(pkStack_18->seq).l] = '\0';
    if (ks._4_4_ == 0x2b) {
      if ((pkStack_18->qual).m < (pkStack_18->seq).m) {
        (pkStack_18->qual).m = (pkStack_18->seq).m;
        pcVar3 = (char *)realloc((pkStack_18->qual).s,(pkStack_18->qual).m);
        (pkStack_18->qual).s = pcVar3;
      }
      do {
        ks._4_4_ = ks_getc(ks_00);
      } while (ks._4_4_ != -1 && ks._4_4_ != 10);
      if (ks._4_4_ == -1) {
        seq_local._4_4_ = -2;
      }
      else {
        do {
          iVar2 = ks_getuntil2(ks_00,2,&pkStack_18->qual,(int *)0x0,1);
          bVar4 = false;
          if (-1 < iVar2) {
            bVar4 = (pkStack_18->qual).l < (pkStack_18->seq).l;
          }
        } while (bVar4);
        pkStack_18->last_char = 0;
        if ((pkStack_18->seq).l == (pkStack_18->qual).l) {
          seq_local._4_4_ = (int)(pkStack_18->seq).l;
        }
        else {
          seq_local._4_4_ = -2;
        }
      }
    }
    else {
      seq_local._4_4_ = (int)(pkStack_18->seq).l;
    }
  }
  return seq_local._4_4_;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_size(char *input_file, int min, int max,int length, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int hit = 0;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

    if (verbose_flag) {
        if (is_fasta)
            fprintf(stderr, "Input is FASTA format\n");
        else
            fprintf(stderr, "Input is FASTQ format\n");
    }

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		hit = size_filter(seq, is_fasta, min, max, length, convert, just_count);
		if (hit)
			count++;
		else
			excluded++;
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}